

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLUtil.cpp
# Opt level: O0

int OSSL::byteString2oid(ByteString *byteString)

{
  int iVar1;
  size_t sVar2;
  int pclass;
  int tag;
  long length;
  uchar *pp;
  uchar *p;
  ASN1_PRINTABLESTRING *curve_name;
  ASN1_OBJECT *oid;
  ByteString *in_stack_ffffffffffffffb8;
  int local_40;
  int local_3c;
  long local_38;
  uchar *local_30;
  uchar *local_28;
  ASN1_PRINTABLESTRING *local_20;
  ASN1_OBJECT *local_18;
  
  local_18 = (ASN1_OBJECT *)0x0;
  local_20 = (ASN1_PRINTABLESTRING *)0x0;
  local_30 = ByteString::const_byte_str(in_stack_ffffffffffffffb8);
  local_28 = local_30;
  sVar2 = ByteString::size((ByteString *)0x13c54e);
  ASN1_get_object(&local_30,&local_38,&local_3c,&local_40,sVar2);
  if ((local_40 == 0) && (local_3c == 6)) {
    sVar2 = ByteString::size((ByteString *)0x13c582);
    local_18 = d2i_ASN1_OBJECT((ASN1_OBJECT **)0x0,&local_28,sVar2);
    if (local_18 == (ASN1_OBJECT *)0x0) {
      return 0;
    }
    iVar1 = OBJ_obj2nid(local_18);
    return iVar1;
  }
  if ((local_40 == 0) && (local_3c == 0x13)) {
    sVar2 = ByteString::size((ByteString *)0x13c5e0);
    local_20 = d2i_ASN1_PRINTABLESTRING((ASN1_PRINTABLESTRING **)0x0,&local_28,sVar2);
    iVar1 = strcmp((char *)local_20->data,"edwards25519");
    if (iVar1 == 0) {
      return 0x43f;
    }
    iVar1 = strcmp((char *)local_20->data,"curve25519");
    if (iVar1 == 0) {
      return 0x40a;
    }
    iVar1 = strcmp((char *)local_20->data,"edwards448");
    if (iVar1 == 0) {
      return 0x440;
    }
    iVar1 = strcmp((char *)local_20->data,"curve448");
    if (iVar1 == 0) {
      return 0x40b;
    }
  }
  return 0;
}

Assistant:

int OSSL::byteString2oid(const ByteString& byteString)
{
	ASN1_OBJECT *oid = NULL;
	ASN1_PRINTABLESTRING *curve_name = NULL;
	const unsigned char *p = byteString.const_byte_str();
	const unsigned char *pp = p;
	long length;
	int tag, pclass;

	ASN1_get_object(&pp, &length, &tag, &pclass, byteString.size());
	if (pclass == V_ASN1_UNIVERSAL && tag == V_ASN1_OBJECT)
	{
		/* The initial release of SoftHSM was expecting just OID value */
		oid = d2i_ASN1_OBJECT(NULL, &p, byteString.size());

		if (oid == NULL)
		{
			return NID_undef;
		}

		return OBJ_obj2nid(oid);
	}
	else if (pclass == V_ASN1_UNIVERSAL && tag == V_ASN1_PRINTABLESTRING)
	{
		/* The final PKCS#11 3.0 expects curve name encoded as PrintableString */
		curve_name = d2i_ASN1_PRINTABLESTRING(NULL, &p, byteString.size());

		if (strcmp((char *)curve_name->data, "edwards25519") == 0)
		{
			return EVP_PKEY_ED25519;
		}

		if (strcmp((char *)curve_name->data, "curve25519") == 0)
		{
			return EVP_PKEY_X25519;
		}

		if (strcmp((char *)curve_name->data, "edwards448") == 0)
		{
			return EVP_PKEY_ED448;
		}

		if (strcmp((char *)curve_name->data, "curve448") == 0)
		{
			return EVP_PKEY_X448;
		}
	}

	return NID_undef;
}